

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::removeScaleFactorsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *scalingIndices,int count,int cumulativeScalingIndex
          ,int partitionIndex)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  int j;
  long lVar6;
  float fVar7;
  double dVar8;
  
  iVar1 = this->gPatternPartitionsStartPatterns[partitionIndex];
  iVar2 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  pfVar3 = this->gScaleBuffers[cumulativeScalingIndex];
  for (uVar5 = 0; uVar5 != (uint)(~(count >> 0x1f) & count); uVar5 = uVar5 + 1) {
    pfVar4 = this->gScaleBuffers[scalingIndices[uVar5]];
    for (lVar6 = (long)iVar1; lVar6 < iVar2; lVar6 = lVar6 + 1) {
      if ((this->kFlags & 0x400) == 0) {
        dVar8 = log((double)pfVar4[lVar6]);
        fVar7 = (float)((double)pfVar3[lVar6] - dVar8);
      }
      else {
        fVar7 = pfVar3[lVar6] - pfVar4[lVar6];
      }
      pfVar3[lVar6] = fVar7;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::removeScaleFactorsByPartition(const int* scalingIndices,
                                                                     int count,
                                                                     int cumulativeScalingIndex,
                                                                     int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
    for(int i=0; i<count; i++) {
        const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
        for(int j=startPattern; j<endPattern; j++) {
            if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                cumulativeScaleBuffer[j] -= scaleBuffer[j];
            else
                cumulativeScaleBuffer[j] -= log(scaleBuffer[j]);
        }
    }

    return BEAGLE_SUCCESS;
}